

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2notes.cpp
# Opt level: O3

void convertMidiFile(MidiFile *midifile,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *matlab)

{
  undefined8 *puVar1;
  byte bVar2;
  char *__s;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *__s_00;
  void *__s_01;
  long lVar8;
  long *plVar9;
  MidiEventList *pMVar10;
  MidiEvent *pMVar11;
  ostream *poVar12;
  size_t sVar13;
  value_type_conflict1 *__val_1;
  byte bVar14;
  value_type_conflict1 *__val;
  ulong uVar15;
  vector<double,_std::allocator<double>_> local_58;
  void *local_40;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_38;
  
  local_38 = matlab;
  smf::MidiFile::absoluteTicks(midifile);
  smf::MidiFile::joinTracks(midifile);
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x40);
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 8;
  *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[4] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[5] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[6] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[7] = 0.0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __s_00 = operator_new(0x400);
  memset(__s_00,0,0x400);
  __s_01 = operator_new(0x200);
  memset(__s_01,0xff,0x200);
  lVar8 = 0;
  do {
    puVar1 = (undefined8 *)((long)__s_00 + lVar8 * 8);
    *puVar1 = 0xbff0000000000000;
    puVar1[1] = 0xbff0000000000000;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 0x80);
  local_40 = __s_01;
  if (verboseQ != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-1\ttpq\t",7);
    iVar5 = smf::MidiFile::getTicksPerQuarterNote(midifile);
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
  }
  iVar5 = 0;
  do {
    iVar6 = smf::MidiFile::getNumEvents(midifile,0);
    if (iVar6 <= iVar5) {
      operator_delete(local_40);
      operator_delete(__s_00);
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
    if (verboseQ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>> ",4);
      pMVar10 = smf::MidiFile::operator[](midifile,0);
      pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
      poVar12 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)&std::cout,
                           (uint)*(pMVar11->super_MidiMessage).
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    }
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&local_58,
               (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,&unused);
    pMVar10 = smf::MidiFile::operator[](midifile,0);
    pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
    bVar14 = *(pMVar11->super_MidiMessage).
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar10 = smf::MidiFile::operator[](midifile,0);
    pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
    bVar2 = *(pMVar11->super_MidiMessage).
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar10 = smf::MidiFile::operator[](midifile,0);
    pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
    if (*(pMVar11->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start == 0xff) {
      pMVar10 = smf::MidiFile::operator[](midifile,0);
      pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
      if (((pMVar11->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[1] == 'Q') &&
         (setTempo(midifile,iVar5,&tempo), verboseQ != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# New Tempo: ",0xd);
        poVar12 = std::ostream::_M_insert<double>(tempo);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      }
    }
    pMVar10 = smf::MidiFile::operator[](midifile,0);
    pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
    if ((*(pMVar11->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start & 0xf) != 9) {
      if (bVar14 < 0xf0) {
        bVar14 = bVar14 & 0xf0;
      }
      else {
        pMVar10 = smf::MidiFile::operator[](midifile,0);
        pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
        bVar14 = *(pMVar11->super_MidiMessage).
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      if (bVar14 < 0xb0) {
        if (bVar14 == 0x80) {
LAB_00111ae5:
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          bVar14 = (pMVar11->super_MidiMessage).
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start[1];
          uVar15 = (ulong)bVar14;
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          dVar3 = tempo;
          iVar6 = pMVar11->tick;
          iVar7 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar4 = getTime(iVar6,dVar3,iVar7);
          legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 1;
          dVar3 = *(double *)((long)__s_00 + uVar15 * 8);
          if (verboseQ == 0) {
            *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = dVar3;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[1] = 1000.0;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[2] = dVar4 - *(double *)((long)__s_00 + uVar15 * 8);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[3] = (double)bVar14;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[4] = (double)*(int *)((long)local_40 + uVar15 * 4);
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[5] =
                 (double)(*(pMVar11->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start & 0xf);
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[6] = (double)pMVar11->track;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[7] = (double)(bVar2 & 0xf);
          }
          else {
            poVar12 = std::ostream::_M_insert<double>(dVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tnote",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tdur=",5);
            poVar12 = std::ostream::_M_insert<double>
                                (dVar4 - *(double *)((long)__s_00 + uVar15 * 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tpch=",5);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(uint)bVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tvel=",5);
            poVar12 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar12,*(int *)((long)local_40 + uVar15 * 4));
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tch=",4);
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            poVar12 = (ostream *)
                      std::ostream::operator<<
                                ((ostream *)poVar12,
                                 *(pMVar11->super_MidiMessage).
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xf);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ttrack=",7);
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            plVar9 = (long *)std::ostream::operator<<((ostream *)poVar12,pMVar11->track);
            std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
            std::ostream::put((char)plVar9);
            std::ostream::flush();
          }
        }
        else if (bVar14 == 0x90) {
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          if ((pMVar11->super_MidiMessage).
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[2] == '\0') goto LAB_00111ae5;
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          uVar15 = (ulong)(pMVar11->super_MidiMessage).
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start[1];
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          bVar2 = (pMVar11->super_MidiMessage).
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          dVar3 = tempo;
          iVar6 = pMVar11->tick;
          iVar7 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar3 = getTime(iVar6,dVar3,iVar7);
          *(double *)((long)__s_00 + uVar15 * 8) = dVar3;
          *(uint *)((long)local_40 + uVar15 * 4) = (uint)bVar2;
        }
        goto LAB_001122e6;
      }
      if (bVar14 == 0xb0) {
        pMVar10 = smf::MidiFile::operator[](midifile,0);
        pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
        legend_controller.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(pMVar11->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[1]] = 1;
        legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[2] = 1;
        if (verboseQ == 0) {
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          dVar3 = tempo;
          iVar6 = pMVar11->tick;
          iVar7 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar3 = getTime(iVar6,dVar3,iVar7);
          *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start = dVar3;
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[1] = 2000.0;
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[2] =
               (double)(pMVar11->super_MidiMessage).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[1];
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[3] =
               (double)(pMVar11->super_MidiMessage).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[2];
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[5] =
               (double)(*(pMVar11->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start & 0xf);
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
LAB_001121f7:
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[6] = (double)pMVar11->track;
          goto LAB_001122e6;
        }
        pMVar10 = smf::MidiFile::operator[](midifile,0);
        pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
        dVar3 = tempo;
        iVar6 = pMVar11->tick;
        iVar7 = smf::MidiFile::getTicksPerQuarterNote(midifile);
        dVar3 = getTime(iVar6,dVar3,iVar7);
        poVar12 = std::ostream::_M_insert<double>(dVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tcontrol",8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ttype=",6);
        pMVar10 = smf::MidiFile::operator[](midifile,0);
        pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
        poVar12 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar12,
                             (uint)(pMVar11->super_MidiMessage).
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tval=",5);
        pMVar10 = smf::MidiFile::operator[](midifile,0);
        pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
        poVar12 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar12,
                             (uint)(pMVar11->super_MidiMessage).
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tch=",4);
        pMVar10 = smf::MidiFile::operator[](midifile,0);
        pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
        poVar12 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar12,
                             *(pMVar11->super_MidiMessage).
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ttrack=",7);
        pMVar10 = smf::MidiFile::operator[](midifile,0);
        pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
LAB_001122c7:
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,pMVar11->track);
LAB_001122d2:
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      }
      else {
        if (bVar14 == 0xc0) {
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          legend_instr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[(pMVar11->super_MidiMessage).
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start[1]] = 1;
          legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[3] = 1;
          if (verboseQ == 0) {
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            dVar3 = tempo;
            iVar6 = pMVar11->tick;
            iVar7 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar3 = getTime(iVar6,dVar3,iVar7);
            *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = dVar3;
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[1] = 3000.0;
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[2] =
                 (double)(pMVar11->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[1];
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[5] =
                 (double)(*(pMVar11->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start & 0xf);
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            goto LAB_001121f7;
          }
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          dVar3 = tempo;
          iVar6 = pMVar11->tick;
          iVar7 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar3 = getTime(iVar6,dVar3,iVar7);
          poVar12 = std::ostream::_M_insert<double>(dVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tinstr",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tname=",6);
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          __s = GMinstrument
                [(pMVar11->super_MidiMessage).
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[1]];
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
          }
          else {
            sVar13 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tnum=",5);
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          poVar12 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar12,
                               (uint)(pMVar11->super_MidiMessage).
                                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\tch=",4);
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          poVar12 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar12,
                               *(pMVar11->super_MidiMessage).
                                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ttrack=",7);
          pMVar10 = smf::MidiFile::operator[](midifile,0);
          pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
          goto LAB_001122c7;
        }
        if (bVar14 == 0xff) {
          if (verboseQ == 0) {
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            dVar3 = tempo;
            iVar6 = pMVar11->tick;
            iVar7 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar3 = getTime(iVar6,dVar3,iVar7);
            *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = dVar3;
          }
          else {
            pMVar10 = smf::MidiFile::operator[](midifile,0);
            pMVar11 = smf::MidiEventList::operator[](pMVar10,iVar5);
            dVar3 = tempo;
            iVar6 = pMVar11->tick;
            iVar7 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar3 = getTime(iVar6,dVar3,iVar7);
            poVar12 = std::ostream::_M_insert<double>(dVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\t",1);
          }
          processMetaEvent(midifile,iVar5,&local_58);
          poVar12 = (ostream *)&std::cout;
          if (verboseQ == 0) goto LAB_001122e6;
          goto LAB_001122d2;
        }
      }
LAB_001122e6:
      if ((local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1] != unused) ||
         (NAN(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1]) || NAN(unused))) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(local_38,&local_58);
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void convertMidiFile(MidiFile& midifile, vector<vector<double> >& matlab) {
   midifile.absoluteTicks();
   midifile.joinTracks();
   vector<double> event(8);
   vector<double> ontimes(128);
   vector<int> onvelocities(128);
   int i;
   for (i=0; i<128; i++) {
      ontimes[i] = -1.0;
      onvelocities[i] = -1;
   }

   if (verboseQ) {
      cout << "-1\ttpq\t" << midifile.getTicksPerQuarterNote() << endl;
   }

   double offtime = 0.0;
   int key = 0;
   int vel = 0;

   for (i=0; i<midifile.getNumEvents(0); i++) {
      if (verboseQ) {
         cout << ">>> " << (int)midifile[0][i][0] << "\n";
      }
      event.assign(event.size(), unused);
      int command = midifile[0][i][0] & 0xf0;
      int channel = midifile[0][i][0] & 0x0f;

      // check for tempo indication
      if (midifile[0][i][0] == 0xff &&
                 midifile[0][i][1] == 0x51) {
         setTempo(midifile, i, tempo);
         if (verboseQ) {
            cout << "# New Tempo: " << tempo << "\n";
         }
      }

      if ((midifile[0][i][0] & 0x0f) == 0x09) {
          continue;
      }
      if (command == 0xf0) {
         command = midifile[0][i][0];
      }
      if (command == 0x90 && midifile[0][i][2] != 0) {
         // store note-on velocity and time
         key = midifile[0][i][1];
         vel = midifile[0][i][2];
         ontimes[key] = getTime(midifile[0][i].tick, tempo,
            midifile.getTicksPerQuarterNote());

         onvelocities[key] = vel;
      } else if (command == 0x90 || command == 0x80) {
         // note off command write to output
         key = midifile[0][i][1];
         offtime = getTime(midifile[0][i].tick, tempo,
            midifile.getTicksPerQuarterNote());
         legend_opcode[OP_NOTE/1000] = 1;

         if (verboseQ) {
            cout
              << ontimes[key]
              << "\tnote"
              << "\tdur=" << offtime - ontimes[key]
              << "\tpch=" << key
              << "\tvel=" << onvelocities[key]
              << "\tch="  << (midifile[0][i][0] & 0x0f)
              << "\ttrack=" << midifile[0][i].track
              << endl;
         } else {
            event[0] = ontimes[key];
            event[1] = OP_NOTE;
            event[2] = offtime - ontimes[key];
            event[3] = key;
            event[4] = onvelocities[key];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
            event[7] = channel;
         }
      } else if (command == 0xb0) {
         legend_controller[midifile[0][i][1]] = 1;
         legend_opcode[OP_CONTROL/1000] = 1;

         if (verboseQ) {
            cout << getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote())
                 << "\tcontrol"
                 << "\ttype="  << (int)midifile[0][i][1]
                 << "\tval="   << (int)midifile[0][i][2]
                 << "\tch="    << (midifile[0][i][0] & 0x0f)
                 << "\ttrack=" << midifile[0][i].track
                 << "\n";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                          midifile.getTicksPerQuarterNote());
            event[1] = OP_CONTROL;
            event[2] = (int)midifile[0][i][1];
            event[3] = (int)midifile[0][i][2];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
         }
      } else if (command == 0xc0) {
         legend_instr[midifile[0][i][1]] = 1;
         legend_opcode[OP_INSTR/1000] = 1;

         if (verboseQ) {
         cout << getTime(midifile[0][i].tick, tempo,
                    midifile.getTicksPerQuarterNote())
              << "\tinstr"
              << "\tname="  << GMinstrument[midifile[0][i][1]]
              << "\tnum="   << (int)midifile[0][i][1]
              << "\tch="    << (midifile[0][i][0] & 0x0f)
              << "\ttrack=" << midifile[0][i].track
              << "\n";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                    midifile.getTicksPerQuarterNote());
            event[1] = OP_INSTR;
            event[2] = (int)midifile[0][i][1];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
         }
      } else if (command == 0xff) {
         if (verboseQ) {
            cout << getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote())
                 << "\t";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote());
         }
         processMetaEvent(midifile, i, event);
         if (verboseQ) {
            cout << "\n";
         }
      }

      if (event[1] != unused) {
         matlab.push_back(event);
      }
   }
}